

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

void __thiscall
inja::SetStatementNode::SetStatementNode(SetStatementNode *this,string *key,size_t pos)

{
  (this->super_StatementNode).super_AstNode.pos = pos;
  (this->super_StatementNode).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_00150a50;
  ::std::__cxx11::string::string((string *)&this->key,(string *)key);
  (this->expression).super_AstNode.pos = 0;
  (this->expression).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_001506b0;
  (this->expression).root.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->expression).root.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

explicit SetStatementNode(const std::string& key, size_t pos): StatementNode(pos), key(key) {}